

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::checkUnknown(SVInt *this)

{
  long lVar1;
  bitwidth_t bVar2;
  uint32_t uVar3;
  void *__dest;
  long *in_RDI;
  uint64_t *newMem;
  uint64_t newVal;
  uint32_t words;
  SVInt *in_stack_ffffffffffffffc8;
  
  if (((*(byte *)((long)in_RDI + 0xd) & 1) != 0) &&
     (bVar2 = countLeadingZeros(in_stack_ffffffffffffffc8), *(uint *)(in_RDI + 1) <= bVar2)) {
    *(undefined1 *)((long)in_RDI + 0xd) = 0;
    uVar3 = getNumWords((SVInt *)0x256a40);
    if (uVar3 == 1) {
      lVar1 = *(long *)*in_RDI;
      if (*in_RDI != 0) {
        operator_delete__((void *)0x256a73);
      }
      *in_RDI = lVar1;
    }
    else {
      __dest = operator_new__(0x256aa7);
      memcpy(__dest,(void *)*in_RDI,(ulong)(uVar3 << 3));
      if (*in_RDI != 0) {
        operator_delete__((void *)0x256ae7);
      }
      *in_RDI = (long)__dest;
    }
  }
  return;
}

Assistant:

void SVInt::checkUnknown() {
    // check if we've lost all of our unknown bits and need
    // to downgrade back to a non-unknown value
    if (!unknownFlag || countLeadingZeros() < bitWidth)
        return;

    unknownFlag = false;
    uint32_t words = getNumWords();
    if (words == 1) {
        uint64_t newVal = pVal[0];
        delete[] pVal;
        val = newVal;
    }
    else {
        uint64_t* newMem = new uint64_t[words];
        memcpy(newMem, pVal, words * WORD_SIZE);
        delete[] pVal;
        pVal = newMem;
    }
}